

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.h
# Opt level: O3

void bitrv2(int n,int *ip,float *a)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  
  *ip = 0;
  if (n < 9) {
    if (n != 8) {
      return;
    }
    uVar4 = 2;
    uVar3 = 1;
  }
  else {
    uVar3 = 1;
    do {
      uVar2 = uVar3;
      n = (uint)n >> 1;
      if (0 < (int)uVar2) {
        uVar9 = 0;
        do {
          ip[uVar2 + uVar9] = ip[uVar9] + n;
          uVar9 = uVar9 + 1;
        } while (uVar2 != uVar9);
      }
      uVar3 = uVar2 * 2;
    } while ((int)(uVar2 * 0x10) < n);
    uVar4 = uVar2 * 4;
    if (uVar2 * 0x10 != n) {
      if ((int)uVar3 < 2) {
        return;
      }
      uVar9 = 1;
      do {
        lVar11 = (long)ip[uVar9];
        uVar10 = 0;
        do {
          lVar8 = (long)ip[uVar10] + (long)((int)uVar9 * 2);
          uVar1 = *(undefined8 *)(a + lVar11 + uVar10 * 2);
          *(undefined8 *)(a + lVar11 + uVar10 * 2) = *(undefined8 *)(a + lVar8);
          *(undefined8 *)(a + lVar8) = uVar1;
          iVar7 = (int)lVar8 + uVar4;
          uVar1 = *(undefined8 *)(a + (ulong)uVar4 + lVar11 + uVar10 * 2);
          *(undefined8 *)(a + (ulong)uVar4 + lVar11 + uVar10 * 2) = *(undefined8 *)(a + iVar7);
          *(undefined8 *)(a + iVar7) = uVar1;
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar3);
      return;
    }
    if ((int)uVar3 < 1) {
      return;
    }
  }
  uVar9 = (ulong)uVar4;
  uVar10 = 0;
  do {
    iVar7 = 0;
    if (uVar10 != 0) {
      iVar7 = ip[uVar10];
      lVar11 = (long)iVar7;
      uVar5 = 0;
      do {
        lVar8 = (long)ip[uVar5] + (long)((int)uVar10 * 2);
        uVar1 = *(undefined8 *)(a + lVar11 + uVar5 * 2);
        *(undefined8 *)(a + lVar11 + uVar5 * 2) = *(undefined8 *)(a + lVar8);
        *(undefined8 *)(a + lVar8) = uVar1;
        iVar6 = (int)lVar8 + uVar3 * 4;
        uVar1 = *(undefined8 *)(a + uVar9 + lVar11 + uVar5 * 2);
        *(undefined8 *)(a + uVar9 + lVar11 + uVar5 * 2) = *(undefined8 *)(a + iVar6);
        *(undefined8 *)(a + iVar6) = uVar1;
        iVar6 = iVar6 - uVar4;
        uVar1 = *(undefined8 *)(a + uVar9 * 2 + lVar11 + uVar5 * 2);
        *(undefined8 *)(a + uVar9 * 2 + lVar11 + uVar5 * 2) = *(undefined8 *)(a + iVar6);
        *(undefined8 *)(a + iVar6) = uVar1;
        iVar6 = iVar6 + uVar3 * 4;
        uVar1 = *(undefined8 *)(a + uVar9 * 3 + lVar11 + uVar5 * 2);
        *(undefined8 *)(a + uVar9 * 3 + lVar11 + uVar5 * 2) = *(undefined8 *)(a + iVar6);
        *(undefined8 *)(a + iVar6) = uVar1;
        uVar5 = uVar5 + 1;
      } while (uVar10 != uVar5);
    }
    iVar7 = iVar7 + (uVar3 + (int)uVar10) * 2;
    uVar1 = *(undefined8 *)(a + iVar7);
    *(undefined8 *)(a + iVar7) = *(undefined8 *)(a + (int)(iVar7 + uVar4));
    *(undefined8 *)(a + (int)(iVar7 + uVar4)) = uVar1;
    uVar10 = uVar10 + 1;
  } while (uVar10 != uVar3);
  return;
}

Assistant:

void bitrv2(int n, int *ip, float *a)
{
    int j, j1, k, k1, l, m, m2;
    float xr, xi, yr, yi;

    ip[0] = 0;
    l = n;
    m = 1;
    while ((m << 3) < l) {
        l >>= 1;
        for (j = 0; j < m; j++) {
            ip[m + j] = ip[j] + l;
        }
        m <<= 1;
    }
    m2 = 2 * m;
    if ((m << 3) == l) {
        for (k = 0; k < m; k++) {
            for (j = 0; j < k; j++) {
                j1 = 2 * j + ip[k];
                k1 = 2 * k + ip[j];
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += 2 * m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 -= m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += 2 * m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
            }
            j1 = 2 * k + m2 + ip[k];
            k1 = j1 + m2;
            xr = a[j1];
            xi = a[j1 + 1];
            yr = a[k1];
            yi = a[k1 + 1];
            a[j1] = yr;
            a[j1 + 1] = yi;
            a[k1] = xr;
            a[k1 + 1] = xi;
        }
    } else {
        for (k = 1; k < m; k++) {
            for (j = 0; j < k; j++) {
                j1 = 2 * j + ip[k];
                k1 = 2 * k + ip[j];
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
                j1 += m2;
                k1 += m2;
                xr = a[j1];
                xi = a[j1 + 1];
                yr = a[k1];
                yi = a[k1 + 1];
                a[j1] = yr;
                a[j1 + 1] = yi;
                a[k1] = xr;
                a[k1 + 1] = xi;
            }
        }
    }
}